

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O1

void column_test_boundary_z5_operators<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>>
               (vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
                *matrix)

{
  uint uVar1;
  pointer pIVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  Field_operators *pFVar5;
  pointer puVar6;
  pointer puVar7;
  Characteristic CVar8;
  int iVar9;
  node_ptr to_erase;
  uint *puVar10;
  long lVar11;
  uint *puVar12;
  Column_dimension_option CVar13;
  node_ptr plVar14;
  Column_support *pCVar15;
  uint uVar16;
  const_node_ptr p_1;
  Column_support *pCVar17;
  pair<unsigned_int,_unsigned_int> *p_3;
  pair<unsigned_int,_unsigned_int> *p;
  pointer puVar18;
  node_ptr prev;
  node_ptr plVar19;
  node_ptr prev_1;
  node_ptr prev_2;
  bool bVar20;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_00;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_01;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_02;
  vector<unsigned_int,_std::allocator<unsigned_int>_> veccont;
  Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
  col3;
  Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
  col4;
  const_iterator __end0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> container_4;
  pair<unsigned_int,_unsigned_int> local_358;
  uint uStack_350;
  undefined4 uStack_34c;
  undefined4 local_348;
  undefined4 uStack_344;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
  col2;
  undefined1 local_300 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> container_5;
  Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
  col1;
  undefined8 local_2a0;
  undefined8 local_298;
  char *local_290;
  list_node<void_*> local_288;
  shared_count sStack_278;
  Column_settings settings;
  undefined1 local_248 [8];
  Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
  col0;
  undefined4 local_214;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::Zp_field_operators
            (&settings.operators,5);
  local_358.first = 0;
  local_358.second = 4;
  uStack_350 = 1;
  uStack_34c = 2;
  local_348 = 2;
  uStack_344 = 1;
  uStack_340._0_4_ = 5;
  uStack_340._4_4_ = 1;
  local_338 = 0x100000006;
  __l._M_len = 5;
  __l._M_array = &local_358;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)&col1,__l,(allocator_type *)&col2);
  CVar8 = settings.operators.characteristic_;
  bVar20 = col1.operators_ != (Field_operators *)col1._0_8_;
  col0.super_Column_dimension_option.dim_ = 0;
  if (bVar20) {
    col0.super_Column_dimension_option.dim_ =
         (int)((ulong)((long)col1.operators_ - col1._0_8_) >> 3) + -1;
  }
  pCVar17 = &col0.column_;
  col0.entryPool_ = (Entry_constructor *)&settings.field_0x20;
  col0.operators_ = &settings.operators;
  plVar19 = (node_ptr)pCVar17;
  col0.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ = (node_ptr)pCVar17;
  col0.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ = (node_ptr)pCVar17;
  puVar12 = (uint *)col1._0_8_;
  while (bVar20) {
    uVar16 = puVar12[1];
    if (CVar8 <= uVar16) {
      uVar16 = uVar16 % CVar8;
    }
    uVar1 = *puVar12;
    puVar10 = (uint *)operator_new(0x20);
    plVar14 = (node_ptr)(puVar10 + 2);
    puVar10[2] = 0;
    puVar10[3] = 0;
    puVar10[4] = 0;
    puVar10[5] = 0;
    puVar10[6] = uVar1;
    *puVar10 = uVar16;
    *(node_ptr *)(puVar10 + 4) = plVar19;
    *(Column_support **)(puVar10 + 2) = pCVar17;
    col0.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ = plVar14;
    (((type *)&plVar19->next_)->data_).root_plus_size_.m_header.super_node.next_ = plVar14;
    puVar12 = puVar12 + 2;
    bVar20 = (Field_operators *)puVar12 != col1.operators_;
    plVar19 = plVar14;
  }
  if (col1._0_8_ != 0) {
    operator_delete((void *)col1._0_8_,(long)col1.entryPool_ - col1._0_8_);
  }
  local_358 = (pair<unsigned_int,_unsigned_int>)
              (matrix->
              super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
  col1._0_8_ = local_358;
  Gudhi::persistence_matrix::
  _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>const&,Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_typ___e,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>::Matrix_column_tag,1u>,false>___1_>
            (&col0,(Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
                    *)local_358,(anon_class_1_0_00000001 *)&col2,
             (anon_class_8_1_e4bd5e45 *)&local_358,(anon_class_8_1_e4bd5e45 *)&col1,
             (anon_class_1_0_00000001 *)&col3,(anon_class_1_0_00000001 *)&col4);
  local_348 = 0;
  uStack_344 = 0;
  uStack_340._0_4_ = 1;
  local_358.first = 0;
  local_358.second = 4;
  uStack_350 = 1;
  uStack_34c = 3;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&veccont,&local_358);
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x386);
  pIVar2 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar16 = (uint)((ulong)((long)veccont.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)veccont.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 2);
  if ((int)uVar16 < 0) {
    lVar11 = 1;
    pCVar17 = &pIVar2->column_;
    do {
      pCVar17 = *(Column_support **)&(pCVar17->super_type).data_.root_plus_size_;
      lVar11 = lVar11 + -1;
    } while (pCVar17 != &pIVar2->column_);
    if (lVar11 != 0) {
      uVar16 = *(int *)&(*(node_ptr *)((long)&(pIVar2->column_).super_type.data_ + 8))[1].next_ + 1;
      goto LAB_00143741;
    }
    col2.super_Column_dimension_option.dim_ = 0;
    col2._4_4_ = 0;
    col2.operators_ = (Field_operators *)0x0;
    col2.entryPool_ = (Entry_constructor *)0x0;
  }
  else {
LAB_00143741:
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&col2,(long)(int)uVar16,
               (allocator_type *)&local_358);
    for (puVar3 = *(undefined8 **)&(pIVar2->column_).super_type.data_.root_plus_size_;
        ((Column_support *)puVar3 != &pIVar2->column_ && (*(uint *)(puVar3 + 2) < uVar16));
        puVar3 = (undefined8 *)*puVar3) {
      *(undefined4 *)(col2._0_8_ + (ulong)*(uint *)(puVar3 + 2) * 4) = *(undefined4 *)(puVar3 + -1);
    }
  }
  if ((long)col2.operators_ - col2._0_8_ ==
      (long)veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
    if (col2.operators_ == (Field_operators *)col2._0_8_) {
      bVar20 = true;
    }
    else {
      iVar9 = bcmp((void *)col2._0_8_,
                   veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,(long)col2.operators_ - col2._0_8_);
      bVar20 = iVar9 == 0;
    }
  }
  else {
    bVar20 = false;
  }
  col1.super_Column_dimension_option.dim_._0_1_ = bVar20;
  col1.operators_ = (Field_operators *)0x0;
  col1.entryPool_ = (Entry_constructor *)0x0;
  col3._0_8_ = anon_var_dwarf_6fb82;
  col3.operators_ = (Field_operators *)0x198124;
  uStack_350 = uStack_350 & 0xffffff00;
  local_358 = (pair<unsigned_int,_unsigned_int>)&PTR__lazy_ostream_001b97f0;
  local_348 = 0x1be128;
  uStack_344 = 0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_58 = "";
  uStack_340 = &col3;
  boost::test_tools::tt_detail::report_assertion(&col1,&local_358,&local_60,0x386,1,0,0);
  boost::detail::shared_count::~shared_count((shared_count *)&col1.entryPool_);
  if (col2._0_8_ != 0) {
    operator_delete((void *)col2._0_8_,(long)col2.entryPool_ - col2._0_8_);
  }
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x388);
  col2.operators_ = (Field_operators *)((ulong)col2.operators_ & 0xffffffffffffff00);
  col2._0_8_ = &PTR__lazy_ostream_001b97b0;
  col2.entryPool_ = (Entry_constructor *)&boost::unit_test::lazy_ostream::inst;
  col2.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ = (node_ptr)0x19425b;
  pCVar15 = &((matrix->
              super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start)->column_;
  local_288.next_ = (node_ptr)0xffffffffffffffff;
  pCVar17 = pCVar15;
  do {
    pCVar17 = *(Column_support **)&(pCVar17->super_type).data_.root_plus_size_;
    local_288.next_ = (node_ptr)((long)&(local_288.next_)->next_ + 1);
  } while (pCVar17 != pCVar15);
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_288;
  container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_298;
  local_298 = (char *)CONCAT44(local_298._4_4_,4);
  col3.super_Column_dimension_option.dim_._0_1_ = local_288.next_ == (node_ptr)0x4;
  col3.operators_ = (Field_operators *)0x0;
  col3.entryPool_ = (Entry_constructor *)0x0;
  col4._0_8_ = anon_var_dwarf_54832;
  col4.operators_ = (Field_operators *)0x194350;
  uStack_340 = (Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
                *)&container_4;
  uStack_350 = uStack_350 & 0xffffff00;
  local_358 = (pair<unsigned_int,_unsigned_int>)&PTR__lazy_ostream_001b96f8;
  local_348 = 0x1be128;
  uStack_344 = 0;
  col1.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ = (node_ptr)&container_5;
  col1.operators_ = (Field_operators *)((ulong)col1.operators_ & 0xffffffffffffff00);
  col1._0_8_ = &PTR__lazy_ostream_001b9770;
  col1.entryPool_ = (Entry_constructor *)&boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&col3,&col2,&col4,0x388,1,2,2,"matrix[0].size()",&local_358,"4",&col1);
  boost::detail::shared_count::~shared_count((shared_count *)&col3.entryPool_);
  local_358.first = 0;
  local_358.second = 1;
  uStack_350 = 1;
  uStack_34c = 3;
  local_348 = 2;
  uStack_344 = 4;
  uStack_340._0_4_ = 5;
  uStack_340._4_4_ = 4;
  local_338 = 0x400000006;
  __l_00._M_len = 5;
  __l_00._M_array = &local_358;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)&col2,__l_00,(allocator_type *)&col3);
  CVar8 = settings.operators.characteristic_;
  pFVar5 = col2.operators_;
  uVar4 = col2._0_8_;
  bVar20 = col2.operators_ != (Field_operators *)col2._0_8_;
  CVar13.dim_ = 0;
  if (bVar20) {
    CVar13.dim_ = (int)((ulong)((long)col2.operators_ - col2._0_8_) >> 3) + -1;
  }
  pCVar17 = &col1.column_;
  col1.super_Column_dimension_option.dim_ = CVar13.dim_;
  col1.entryPool_ = (Entry_constructor *)&settings.field_0x20;
  col1.operators_ = &settings.operators;
  plVar19 = (node_ptr)pCVar17;
  col1.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ = (node_ptr)pCVar17;
  col1.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ = (node_ptr)pCVar17;
  puVar12 = (uint *)col2._0_8_;
  while (bVar20) {
    uVar16 = puVar12[1];
    if (CVar8 <= uVar16) {
      uVar16 = uVar16 % CVar8;
    }
    uVar1 = *puVar12;
    puVar10 = (uint *)operator_new(0x20);
    plVar14 = (node_ptr)(puVar10 + 2);
    puVar10[2] = 0;
    puVar10[3] = 0;
    puVar10[4] = 0;
    puVar10[5] = 0;
    puVar10[6] = uVar1;
    *puVar10 = uVar16;
    *(node_ptr *)(puVar10 + 4) = plVar19;
    *(Column_support **)(puVar10 + 2) = pCVar17;
    col1.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ = plVar14;
    (((type *)&plVar19->next_)->data_).root_plus_size_.m_header.super_node.next_ = plVar14;
    puVar12 = puVar12 + 2;
    bVar20 = (Field_operators *)puVar12 != pFVar5;
    plVar19 = plVar14;
  }
  if (uVar4 != 0) {
    operator_delete((void *)uVar4,(long)col2.entryPool_ - uVar4);
  }
  local_358 = (pair<unsigned_int,_unsigned_int>)
              ((matrix->
               super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 1);
  col2._0_8_ = local_358;
  Gudhi::persistence_matrix::
  _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>const&,Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_typ___e,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>::Matrix_column_tag,1u>,false>___1_>
            (&col1,(Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
                    *)local_358,(anon_class_1_0_00000001 *)&col3,
             (anon_class_8_1_e4bd5e45 *)&local_358,(anon_class_8_1_e4bd5e45 *)&col2,
             (anon_class_1_0_00000001 *)&col4,(anon_class_1_0_00000001 *)&container_4);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&veccont,0,0);
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_88 = "";
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_90,0x38f);
  pIVar2 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar16 = (uint)((ulong)((long)veccont.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)veccont.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 2);
  if ((int)uVar16 < 0) {
    lVar11 = 1;
    pCVar17 = &pIVar2[1].column_;
    do {
      pCVar17 = *(Column_support **)&(pCVar17->super_type).data_.root_plus_size_;
      lVar11 = lVar11 + -1;
    } while (pCVar17 != &pIVar2[1].column_);
    if (lVar11 != 0) {
      uVar16 = *(int *)&(*(node_ptr *)((long)&pIVar2[1].column_.super_type.data_ + 8))[1].next_ + 1;
      goto LAB_00143c3b;
    }
    col3.super_Column_dimension_option.dim_ = 0;
    col3._4_4_ = 0;
    col3.operators_ = (Field_operators *)0x0;
    col3.entryPool_ = (Entry_constructor *)0x0;
  }
  else {
LAB_00143c3b:
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&col3,(long)(int)uVar16,
               (allocator_type *)&local_358);
    for (puVar3 = *(undefined8 **)&pIVar2[1].column_.super_type.data_.root_plus_size_;
        ((Column_support *)puVar3 != &pIVar2[1].column_ && (*(uint *)(puVar3 + 2) < uVar16));
        puVar3 = (undefined8 *)*puVar3) {
      *(undefined4 *)(col3._0_8_ + (ulong)*(uint *)(puVar3 + 2) * 4) = *(undefined4 *)(puVar3 + -1);
    }
  }
  if ((long)col3.operators_ - col3._0_8_ ==
      (long)veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
    if (col3.operators_ == (Field_operators *)col3._0_8_) {
      bVar20 = true;
    }
    else {
      iVar9 = bcmp((void *)col3._0_8_,
                   veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,(long)col3.operators_ - col3._0_8_);
      bVar20 = iVar9 == 0;
    }
  }
  else {
    bVar20 = false;
  }
  col2.super_Column_dimension_option.dim_._0_1_ = bVar20;
  col2.operators_ = (Field_operators *)0x0;
  col2.entryPool_ = (Entry_constructor *)0x0;
  col4._0_8_ = anon_var_dwarf_6fba9;
  col4.operators_ = (Field_operators *)0x198168;
  uStack_350 = uStack_350 & 0xffffff00;
  local_358 = (pair<unsigned_int,_unsigned_int>)&PTR__lazy_ostream_001b97f0;
  local_348 = 0x1be128;
  uStack_344 = 0;
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_a8 = "";
  uStack_340 = &col4;
  boost::test_tools::tt_detail::report_assertion(&col2,&local_358,&local_b0,0x38f,1,0,0);
  boost::detail::shared_count::~shared_count((shared_count *)&col2.entryPool_);
  if (col3._0_8_ != 0) {
    operator_delete((void *)col3._0_8_,(long)col3.entryPool_ - col3._0_8_);
  }
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x391);
  col3.operators_ = (Field_operators *)((ulong)col3.operators_ & 0xffffffffffffff00);
  col3._0_8_ = &PTR__lazy_ostream_001b97b0;
  col3.entryPool_ = (Entry_constructor *)&boost::unit_test::lazy_ostream::inst;
  col3.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ = (node_ptr)0x19425b;
  pCVar15 = &(matrix->
             super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start[1].column_;
  lVar11 = 1;
  pCVar17 = pCVar15;
  do {
    pCVar17 = *(Column_support **)&(pCVar17->super_type).data_.root_plus_size_;
    lVar11 = lVar11 + -1;
  } while (pCVar17 != pCVar15);
  local_298 = (char *)-lVar11;
  local_288.next_ = (node_ptr)local_300;
  local_300 = (undefined1  [8])((ulong)(uint)local_300._4_4_ << 0x20);
  col4.super_Column_dimension_option.dim_._0_1_ = lVar11 == 0;
  col4.operators_ = (Field_operators *)0x0;
  col4.entryPool_ = (Entry_constructor *)0x0;
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_54832;
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x194350;
  container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_298;
  uStack_350 = uStack_350 & 0xffffff00;
  local_358 = (pair<unsigned_int,_unsigned_int>)&PTR__lazy_ostream_001b96f8;
  local_348 = 0x1be128;
  uStack_344 = 0;
  uStack_340 = (Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
                *)&container_5;
  col2.operators_ = (Field_operators *)((ulong)col2.operators_ & 0xffffffffffffff00);
  col2._0_8_ = &PTR__lazy_ostream_001b9770;
  col2.entryPool_ = (Entry_constructor *)&boost::unit_test::lazy_ostream::inst;
  col2.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ = &local_288;
  boost::test_tools::tt_detail::report_assertion
            (&col4,&col3,&container_4,0x391,1,2,2,"matrix[1].size()",&local_358,"0",&col2);
  boost::detail::shared_count::~shared_count((shared_count *)&col4.entryPool_);
  local_358.first = 4;
  Gudhi::persistence_matrix::
  _multiply_target_and_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>>
            (&local_358.first,&col1,
             (matrix->
             super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 4);
  local_348 = 0;
  uStack_344 = 0;
  uStack_340._0_4_ = 4;
  local_358.first = 0;
  local_358.second = 1;
  uStack_350 = 4;
  uStack_34c = 2;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&veccont,&local_358);
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e0,0x397);
  pIVar2 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar16 = (uint)((ulong)((long)veccont.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)veccont.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 2);
  if ((int)uVar16 < 0) {
    lVar11 = 1;
    pCVar17 = &pIVar2[4].column_;
    do {
      pCVar17 = *(Column_support **)&(pCVar17->super_type).data_.root_plus_size_;
      lVar11 = lVar11 + -1;
    } while (pCVar17 != &pIVar2[4].column_);
    if (lVar11 != 0) {
      uVar16 = *(int *)&(*(node_ptr *)((long)&pIVar2[4].column_.super_type.data_ + 8))[1].next_ + 1;
      goto LAB_00143fd0;
    }
    col3.super_Column_dimension_option.dim_ = 0;
    col3._4_4_ = 0;
    col3.operators_ = (Field_operators *)0x0;
    col3.entryPool_ = (Entry_constructor *)0x0;
  }
  else {
LAB_00143fd0:
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&col3,(long)(int)uVar16,
               (allocator_type *)&local_358);
    for (puVar3 = *(undefined8 **)&pIVar2[4].column_.super_type.data_.root_plus_size_;
        ((Column_support *)puVar3 != &pIVar2[4].column_ && (*(uint *)(puVar3 + 2) < uVar16));
        puVar3 = (undefined8 *)*puVar3) {
      *(undefined4 *)(col3._0_8_ + (ulong)*(uint *)(puVar3 + 2) * 4) = *(undefined4 *)(puVar3 + -1);
    }
  }
  if ((long)col3.operators_ - col3._0_8_ ==
      (long)veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
    if (col3.operators_ == (Field_operators *)col3._0_8_) {
      bVar20 = true;
    }
    else {
      iVar9 = bcmp((void *)col3._0_8_,
                   veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,(long)col3.operators_ - col3._0_8_);
      bVar20 = iVar9 == 0;
    }
  }
  else {
    bVar20 = false;
  }
  col2.super_Column_dimension_option.dim_._0_1_ = bVar20;
  col2.operators_ = (Field_operators *)0x0;
  col2.entryPool_ = (Entry_constructor *)0x0;
  col4._0_8_ = anon_var_dwarf_6fbc3;
  col4.operators_ = (Field_operators *)0x1981aa;
  uStack_350 = uStack_350 & 0xffffff00;
  local_358 = (pair<unsigned_int,_unsigned_int>)&PTR__lazy_ostream_001b97f0;
  local_348 = 0x1be128;
  uStack_344 = 0;
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_f8 = "";
  uStack_340 = &col4;
  boost::test_tools::tt_detail::report_assertion(&col2,&local_358,&local_100,0x397,1,0,0);
  boost::detail::shared_count::~shared_count((shared_count *)&col2.entryPool_);
  if (col3._0_8_ != 0) {
    operator_delete((void *)col3._0_8_,(long)col3.entryPool_ - col3._0_8_);
  }
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_108 = "";
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_110,0x399);
  col3.operators_ = (Field_operators *)((ulong)col3.operators_ & 0xffffffffffffff00);
  col3._0_8_ = &PTR__lazy_ostream_001b97b0;
  col3.entryPool_ = (Entry_constructor *)&boost::unit_test::lazy_ostream::inst;
  col3.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ = (node_ptr)0x19425b;
  pCVar15 = &(matrix->
             super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start[4].column_;
  local_298 = (char *)0xffffffffffffffff;
  pCVar17 = pCVar15;
  do {
    pCVar17 = *(Column_support **)&(pCVar17->super_type).data_.root_plus_size_;
    local_298 = (char *)((long)local_298 + 1);
  } while (pCVar17 != pCVar15);
  local_300._0_4_ = 4;
  col4.super_Column_dimension_option.dim_._0_1_ = local_298 == (char *)0x4;
  col4.operators_ = (Field_operators *)0x0;
  col4.entryPool_ = (Entry_constructor *)0x0;
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_54832;
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x194350;
  container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_298;
  uStack_350 = uStack_350 & 0xffffff00;
  local_358 = (pair<unsigned_int,_unsigned_int>)&PTR__lazy_ostream_001b96f8;
  local_348 = 0x1be128;
  uStack_344 = 0;
  uStack_340 = (Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
                *)&container_5;
  local_288.next_ = (node_ptr)local_300;
  col2.operators_ = (Field_operators *)((ulong)col2.operators_ & 0xffffffffffffff00);
  col2._0_8_ = &PTR__lazy_ostream_001b9770;
  col2.entryPool_ = (Entry_constructor *)&boost::unit_test::lazy_ostream::inst;
  col2.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ = &local_288;
  boost::test_tools::tt_detail::report_assertion
            (&col4,&col3,&container_4,0x399,1,2,2,"matrix[4].size()",&local_358,"4",&col2);
  boost::detail::shared_count::~shared_count((shared_count *)&col4.entryPool_);
  col2.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ = (node_ptr)&col2.column_;
  col2._0_8_ = col2._0_8_ & 0xffffffff00000000;
  col2.entryPool_ = (Entry_constructor *)&settings.field_0x20;
  col2.operators_ = &settings.operators;
  local_358.first = 3;
  col2.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ =
       col2.column_.super_type.data_.root_plus_size_.m_header.super_node.next_;
  Gudhi::persistence_matrix::
  _multiply_source_and_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>>
            (&local_358.first,&col2,
             (matrix->
             super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 5);
  local_348 = 0;
  uStack_344 = 1;
  uStack_340._0_4_ = 1;
  local_358.first = 4;
  local_358.second = 2;
  uStack_350 = 1;
  uStack_34c = 0;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&veccont,&local_358);
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_130,0x39f);
  pIVar2 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar16 = (uint)((ulong)((long)veccont.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)veccont.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 2);
  if ((int)uVar16 < 0) {
    lVar11 = 1;
    pCVar17 = &pIVar2[5].column_;
    do {
      pCVar17 = *(Column_support **)&(pCVar17->super_type).data_.root_plus_size_;
      lVar11 = lVar11 + -1;
    } while (pCVar17 != &pIVar2[5].column_);
    if (lVar11 != 0) {
      uVar16 = *(int *)&(*(node_ptr *)((long)&pIVar2[5].column_.super_type.data_ + 8))[1].next_ + 1;
      goto LAB_001443a3;
    }
    col4.super_Column_dimension_option.dim_ = 0;
    col4._4_4_ = 0;
    col4.operators_ = (Field_operators *)0x0;
    col4.entryPool_ = (Entry_constructor *)0x0;
  }
  else {
LAB_001443a3:
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&col4,(long)(int)uVar16,
               (allocator_type *)&local_358);
    for (puVar3 = *(undefined8 **)&pIVar2[5].column_.super_type.data_.root_plus_size_;
        ((Column_support *)puVar3 != &pIVar2[5].column_ && (*(uint *)(puVar3 + 2) < uVar16));
        puVar3 = (undefined8 *)*puVar3) {
      *(undefined4 *)(col4._0_8_ + (ulong)*(uint *)(puVar3 + 2) * 4) = *(undefined4 *)(puVar3 + -1);
    }
  }
  if ((long)col4.operators_ - col4._0_8_ ==
      (long)veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
    if (col4.operators_ == (Field_operators *)col4._0_8_) {
      bVar20 = true;
    }
    else {
      iVar9 = bcmp((void *)col4._0_8_,
                   veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,(long)col4.operators_ - col4._0_8_);
      bVar20 = iVar9 == 0;
    }
  }
  else {
    bVar20 = false;
  }
  col3.super_Column_dimension_option.dim_._0_1_ = bVar20;
  col3.operators_ = (Field_operators *)0x0;
  col3.entryPool_ = (Entry_constructor *)0x0;
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_6fbdd;
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x1981ec;
  uStack_350 = uStack_350 & 0xffffff00;
  local_358 = (pair<unsigned_int,_unsigned_int>)&PTR__lazy_ostream_001b97f0;
  local_348 = 0x1be128;
  uStack_344 = 0;
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_148 = "";
  uStack_340 = (Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
                *)&container_4;
  boost::test_tools::tt_detail::report_assertion(&col3,&local_358,&local_150,0x39f,1,0,0);
  boost::detail::shared_count::~shared_count((shared_count *)&col3.entryPool_);
  if (col4._0_8_ != 0) {
    operator_delete((void *)col4._0_8_,(long)col4.entryPool_ - col4._0_8_);
  }
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x3a0);
  col4.operators_ = (Field_operators *)((ulong)col4.operators_ & 0xffffffffffffff00);
  col4._0_8_ = &PTR__lazy_ostream_001b97b0;
  col4.entryPool_ = (Entry_constructor *)&boost::unit_test::lazy_ostream::inst;
  col4.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ = (node_ptr)0x19425b;
  pCVar15 = &(matrix->
             super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start[5].column_;
  local_300 = (undefined1  [8])0xffffffffffffffff;
  pCVar17 = pCVar15;
  do {
    pCVar17 = *(Column_support **)&(pCVar17->super_type).data_.root_plus_size_;
    local_300 = (undefined1  [8])((long)&((node_ptr)local_300)->next_ + 1);
  } while (pCVar17 != pCVar15);
  local_298 = (char *)&local_2a0;
  local_2a0 = (undefined4 *)CONCAT44(local_2a0._4_4_,5);
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         local_300 == (undefined1  [8])0x5);
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_54832;
  container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x194350;
  local_288.next_ = (node_ptr)local_300;
  uStack_350 = uStack_350 & 0xffffff00;
  local_358 = (pair<unsigned_int,_unsigned_int>)&PTR__lazy_ostream_001b96f8;
  local_348 = 0x1be128;
  uStack_344 = 0;
  uStack_340 = (Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
                *)&local_288;
  col3.operators_ = (Field_operators *)((ulong)col3.operators_ & 0xffffffffffffff00);
  col3._0_8_ = &PTR__lazy_ostream_001b9770;
  col3.entryPool_ = (Entry_constructor *)&boost::unit_test::lazy_ostream::inst;
  col3.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ = (node_ptr)&local_298;
  boost::test_tools::tt_detail::report_assertion
            (&container_4,&col4,&container_5,0x3a0,1,2,2,"matrix[5].size()",&local_358,"5",&col3);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_358.first = 0;
  local_358.second = 3;
  uStack_350 = 2;
  uStack_34c = 1;
  local_348 = 3;
  uStack_344 = 2;
  uStack_340._0_4_ = 5;
  uStack_340._4_4_ = 2;
  local_338 = 0x100000006;
  __l_01._M_len = 5;
  __l_01._M_array = &local_358;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)&col4,__l_01,(allocator_type *)&container_4);
  CVar8 = settings.operators.characteristic_;
  pFVar5 = col4.operators_;
  uVar4 = col4._0_8_;
  bVar20 = col4.operators_ != (Field_operators *)col4._0_8_;
  CVar13.dim_ = 0;
  if (bVar20) {
    CVar13.dim_ = (int)((ulong)((long)col4.operators_ - col4._0_8_) >> 3) + -1;
  }
  col3.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ = (node_ptr)&col3.column_;
  col3.super_Column_dimension_option.dim_ = CVar13.dim_;
  col3.entryPool_ = (Entry_constructor *)&settings.field_0x20;
  col3.operators_ = &settings.operators;
  plVar19 = col3.column_.super_type.data_.root_plus_size_.m_header.super_node.next_;
  col3.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ =
       col3.column_.super_type.data_.root_plus_size_.m_header.super_node.next_;
  puVar12 = (uint *)col4._0_8_;
  while (bVar20) {
    uVar16 = puVar12[1];
    if (CVar8 <= uVar16) {
      uVar16 = uVar16 % CVar8;
    }
    uVar1 = *puVar12;
    puVar10 = (uint *)operator_new(0x20);
    plVar14 = (node_ptr)(puVar10 + 2);
    puVar10[2] = 0;
    puVar10[3] = 0;
    puVar10[4] = 0;
    puVar10[5] = 0;
    puVar10[6] = uVar1;
    *puVar10 = uVar16;
    *(node_ptr *)(puVar10 + 4) = plVar19;
    *(Column_support **)(puVar10 + 2) = &col3.column_;
    col3.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ = plVar14;
    (((type *)&plVar19->next_)->data_).root_plus_size_.m_header.super_node.next_ = plVar14;
    puVar12 = puVar12 + 2;
    bVar20 = (Field_operators *)puVar12 != pFVar5;
    plVar19 = plVar14;
  }
  if (uVar4 != 0) {
    operator_delete((void *)uVar4,(long)col4.entryPool_ - uVar4);
  }
  local_358.first = 3;
  Gudhi::persistence_matrix::
  _multiply_source_and_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>>
            (&local_358.first,&col3,
             (matrix->
             super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 5);
  local_348 = 0;
  uStack_344 = 2;
  uStack_340._0_4_ = 4;
  local_358.first = 3;
  local_358.second = 2;
  uStack_350 = 4;
  uStack_34c = 1;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&veccont,&local_358);
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_180,0x3a5);
  pIVar2 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar16 = (uint)((ulong)((long)veccont.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)veccont.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 2);
  if ((int)uVar16 < 0) {
    lVar11 = 1;
    pCVar17 = &pIVar2[5].column_;
    do {
      pCVar17 = *(Column_support **)&(pCVar17->super_type).data_.root_plus_size_;
      lVar11 = lVar11 + -1;
    } while (pCVar17 != &pIVar2[5].column_);
    if (lVar11 != 0) {
      uVar16 = *(int *)&(*(node_ptr *)((long)&pIVar2[5].column_.super_type.data_ + 8))[1].next_ + 1;
      goto LAB_00144855;
    }
    container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
LAB_00144855:
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&container_4,(long)(int)uVar16,(allocator_type *)&local_358);
    for (puVar3 = *(undefined8 **)&pIVar2[5].column_.super_type.data_.root_plus_size_;
        ((Column_support *)puVar3 != &pIVar2[5].column_ && (*(uint *)(puVar3 + 2) < uVar16));
        puVar3 = (undefined8 *)*puVar3) {
      container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[*(uint *)(puVar3 + 2)] = *(uint *)(puVar3 + -1);
    }
  }
  if ((long)container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start ==
      (long)veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
    if (container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start) {
      bVar20 = true;
    }
    else {
      iVar9 = bcmp(container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (long)container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_start);
      bVar20 = iVar9 == 0;
    }
  }
  else {
    bVar20 = false;
  }
  col4.super_Column_dimension_option.dim_._0_1_ = bVar20;
  col4.operators_ = (Field_operators *)0x0;
  col4.entryPool_ = (Entry_constructor *)0x0;
  container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_6fbdd;
  container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x1981ec;
  uStack_350 = uStack_350 & 0xffffff00;
  local_358 = (pair<unsigned_int,_unsigned_int>)&PTR__lazy_ostream_001b97f0;
  local_348 = 0x1be128;
  uStack_344 = 0;
  uStack_340 = (Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
                *)&container_5;
  local_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_198 = "";
  boost::test_tools::tt_detail::report_assertion(&col4,&local_358,&local_1a0,0x3a5,1,0,0);
  boost::detail::shared_count::~shared_count((shared_count *)&col4.entryPool_);
  if (container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)container_4.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)container_4.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1a8 = "";
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1b0,0x3a7);
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_001b97b0;
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&boost::unit_test::lazy_ostream::inst;
  pCVar15 = &(matrix->
             super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start[5].column_;
  local_2a0 = (undefined4 *)0xffffffffffffffff;
  pCVar17 = pCVar15;
  do {
    pCVar17 = *(Column_support **)&(pCVar17->super_type).data_.root_plus_size_;
    local_2a0 = (undefined4 *)((long)local_2a0 + 1);
  } while (pCVar17 != pCVar15);
  local_300 = (undefined1  [8])local_248;
  local_248._0_4_ = 6;
  container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         local_2a0 == (undefined4 *)0x6);
  container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_288.next_ = (node_ptr)0x1942dd;
  local_288.prev_ = (node_ptr)0x194350;
  local_298 = (char *)&local_2a0;
  uStack_350 = uStack_350 & 0xffffff00;
  local_358 = (pair<unsigned_int,_unsigned_int>)&PTR__lazy_ostream_001b96f8;
  local_348 = 0x1be128;
  uStack_344 = 0;
  uStack_340 = (Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
                *)&local_298;
  col4.operators_ = (Field_operators *)((ulong)col4.operators_ & 0xffffffffffffff00);
  col4._0_8_ = &PTR__lazy_ostream_001b9770;
  col4.entryPool_ = (Entry_constructor *)&boost::unit_test::lazy_ostream::inst;
  col4.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ = (node_ptr)local_300;
  boost::test_tools::tt_detail::report_assertion
            (&container_5,&container_4,&local_288,0x3a7,1,2,2,"matrix[5].size()",&local_358,"6",
             &col4);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_358.first = 0;
  local_358.second = 3;
  uStack_350 = 1;
  uStack_34c = 2;
  local_348 = 2;
  uStack_344 = 4;
  uStack_340._0_4_ = 3;
  uStack_340._4_4_ = 1;
  local_338 = 0x200000005;
  uStack_330 = 0x400000006;
  __l_02._M_len = 6;
  __l_02._M_array = &local_358;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)&container_4,__l_02,(allocator_type *)&container_5);
  puVar7 = container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar6 = container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  CVar13.dim_ = 0;
  if (container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    CVar13.dim_ = (int)((ulong)((long)container_4.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)container_4.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
  }
  col4.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ = (node_ptr)&col4.column_;
  col4.super_Column_dimension_option.dim_ = CVar13.dim_;
  col4.entryPool_ = (Entry_constructor *)&settings.field_0x20;
  col4.operators_ = &settings.operators;
  col4.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ =
       col4.column_.super_type.data_.root_plus_size_.m_header.super_node.next_;
  if (container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    puVar18 = container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
    plVar19 = (node_ptr)&col4.column_;
    do {
      uVar16 = puVar18[1];
      if (settings.operators.characteristic_ <= uVar16) {
        uVar16 = uVar16 % settings.operators.characteristic_;
      }
      uVar1 = *puVar18;
      puVar12 = (uint *)operator_new(0x20);
      plVar14 = (node_ptr)(puVar12 + 2);
      puVar12[2] = 0;
      puVar12[3] = 0;
      puVar12[4] = 0;
      puVar12[5] = 0;
      puVar12[6] = uVar1;
      *puVar12 = uVar16;
      *(node_ptr *)(puVar12 + 4) = plVar19;
      *(Column_support **)(puVar12 + 2) = &col4.column_;
      col4.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ = plVar14;
      (((type *)&plVar19->next_)->data_).root_plus_size_.m_header.super_node.next_ = plVar14;
      puVar18 = puVar18 + 2;
      plVar19 = plVar14;
    } while (puVar18 != puVar7);
  }
  if (puVar6 != (pointer)0x0) {
    operator_delete(puVar6,(long)container_4.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar6);
  }
  local_358.first = 4;
  Gudhi::persistence_matrix::
  _multiply_target_and_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>>
            (&local_358.first,&col4,
             (matrix->
             super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 3);
  local_348 = 0;
  uStack_344 = 2;
  uStack_340._0_4_ = 4;
  local_358.first = 3;
  local_358.second = 2;
  uStack_350 = 4;
  uStack_34c = 1;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&veccont,&local_358);
  local_1d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1c8 = "";
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1d0,0x3ad);
  pIVar2 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar16 = (uint)((ulong)((long)veccont.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)veccont.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 2);
  if ((int)uVar16 < 0) {
    lVar11 = 1;
    pCVar17 = &pIVar2[3].column_;
    do {
      pCVar17 = *(Column_support **)&(pCVar17->super_type).data_.root_plus_size_;
      lVar11 = lVar11 + -1;
    } while (pCVar17 != &pIVar2[3].column_);
    if (lVar11 == 0) {
      container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      goto LAB_00144db7;
    }
    uVar16 = *(int *)&(*(node_ptr *)((long)&pIVar2[3].column_.super_type.data_ + 8))[1].next_ + 1;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&container_5,(long)(int)uVar16,(allocator_type *)&local_358);
  for (puVar3 = *(undefined8 **)&pIVar2[3].column_.super_type.data_.root_plus_size_;
      ((Column_support *)puVar3 != &pIVar2[3].column_ && (*(uint *)(puVar3 + 2) < uVar16));
      puVar3 = (undefined8 *)*puVar3) {
    container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[*(uint *)(puVar3 + 2)] = *(uint *)(puVar3 + -1);
  }
LAB_00144db7:
  if ((long)container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start ==
      (long)veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
    if (container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start) {
      bVar20 = true;
    }
    else {
      iVar9 = bcmp(container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (long)container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_start);
      bVar20 = iVar9 == 0;
    }
  }
  else {
    bVar20 = false;
  }
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,bVar20);
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_288.next_ = (node_ptr)0x198202;
  local_288.prev_ = (node_ptr)0x198232;
  uStack_350 = uStack_350 & 0xffffff00;
  local_358 = (pair<unsigned_int,_unsigned_int>)&PTR__lazy_ostream_001b97f0;
  local_348 = 0x1be128;
  uStack_344 = 0;
  uStack_340 = (Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
                *)&local_288;
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1e8 = "";
  boost::test_tools::tt_detail::report_assertion(&container_4,&local_358,&local_1f0,0x3ad,1,0,0);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  if (container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)container_5.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)container_5.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1f8 = "";
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_200,0x3af);
  container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_001b97b0;
  container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&boost::unit_test::lazy_ostream::inst;
  pCVar15 = &(matrix->
             super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start[3].column_;
  local_248 = (undefined1  [8])0xffffffffffffffff;
  pCVar17 = pCVar15;
  do {
    pCVar17 = *(Column_support **)&(pCVar17->super_type).data_.root_plus_size_;
    local_248 = (undefined1  [8])((long)&((node_ptr)local_248)->next_ + 1);
  } while (pCVar17 != pCVar15);
  local_2a0 = &local_214;
  local_214 = 6;
  local_288.next_ = (node_ptr)CONCAT71(local_288.next_._1_7_,local_248 == (undefined1  [8])0x6);
  local_288.prev_ = (node_ptr)0x0;
  sStack_278.pi_ = (sp_counted_base *)0x0;
  local_298 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_290 = "";
  local_300 = (undefined1  [8])local_248;
  uStack_350 = uStack_350 & 0xffffff00;
  local_358 = (pair<unsigned_int,_unsigned_int>)&PTR__lazy_ostream_001b96f8;
  local_348 = 0x1be128;
  uStack_344 = 0;
  uStack_340 = (Intrusive_list_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
                *)local_300;
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_001b9770;
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_288,&container_5,&local_298,0x3af,1,2,2,"matrix[3].size()",&local_358,"6",
             &container_4);
  boost::detail::shared_count::~shared_count(&sStack_278);
  plVar19 = col4.column_.super_type.data_.root_plus_size_.m_header.super_node.next_;
  while (plVar19 != (node_ptr)&col4.column_) {
    plVar14 = plVar19->next_;
    plVar19->next_ = (node_ptr)0x0;
    plVar19->prev_ = (node_ptr)0x0;
    Gudhi::persistence_matrix::
    New_entry_constructor<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>
    ::destroy(col4.entryPool_,
              (Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
               *)&plVar19[-1].prev_);
    plVar19 = plVar14;
  }
  col4.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ = (node_ptr)0x0;
  col4.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ = (node_ptr)0x0;
  plVar19 = col3.column_.super_type.data_.root_plus_size_.m_header.super_node.next_;
  while (plVar19 != (node_ptr)&col3.column_) {
    plVar14 = plVar19->next_;
    plVar19->next_ = (node_ptr)0x0;
    plVar19->prev_ = (node_ptr)0x0;
    Gudhi::persistence_matrix::
    New_entry_constructor<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>
    ::destroy(col3.entryPool_,
              (Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
               *)&plVar19[-1].prev_);
    plVar19 = plVar14;
  }
  col3.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ = (node_ptr)0x0;
  col3.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ = (node_ptr)0x0;
  plVar19 = col2.column_.super_type.data_.root_plus_size_.m_header.super_node.next_;
  while (plVar19 != (node_ptr)&col2.column_) {
    plVar14 = plVar19->next_;
    plVar19->next_ = (node_ptr)0x0;
    plVar19->prev_ = (node_ptr)0x0;
    Gudhi::persistence_matrix::
    New_entry_constructor<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>
    ::destroy(col2.entryPool_,
              (Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
               *)&plVar19[-1].prev_);
    plVar19 = plVar14;
  }
  col2.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ = (node_ptr)0x0;
  col2.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ = (node_ptr)0x0;
  plVar19 = col1.column_.super_type.data_.root_plus_size_.m_header.super_node.next_;
  while (plVar19 != (node_ptr)&col1.column_) {
    plVar14 = plVar19->next_;
    plVar19->next_ = (node_ptr)0x0;
    plVar19->prev_ = (node_ptr)0x0;
    Gudhi::persistence_matrix::
    New_entry_constructor<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>
    ::destroy(col1.entryPool_,
              (Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
               *)&plVar19[-1].prev_);
    plVar19 = plVar14;
  }
  col1.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ = (node_ptr)0x0;
  col1.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ = (node_ptr)0x0;
  plVar19 = col0.column_.super_type.data_.root_plus_size_.m_header.super_node.next_;
  while (plVar19 != (node_ptr)&col0.column_) {
    plVar14 = plVar19->next_;
    plVar19->next_ = (node_ptr)0x0;
    plVar19->prev_ = (node_ptr)0x0;
    Gudhi::persistence_matrix::
    New_entry_constructor<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>_>
    ::destroy(col0.entryPool_,
              (Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
               *)&plVar19[-1].prev_);
    plVar19 = plVar14;
  }
  col0.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ = (node_ptr)0x0;
  col0.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ = (node_ptr)0x0;
  if (settings.operators.inverse_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(settings.operators.inverse_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)settings.operators.inverse_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)settings.operators.inverse_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void column_test_boundary_z5_operators(std::vector<Column>& matrix) {
  using cont = std::vector<std::pair<unsigned int, typename Column::Field_element> >;

  std::vector<typename Column::Field_element> veccont;
  typename Column::Column_settings settings(5);

  const Column col0(cont{{0, 4}, {1, 2}, {2, 1}, {5, 1}, {6, 1}}, &settings);
  matrix[0] += col0;

  veccont = {0, 4, 1, 3, 0, 0, 1};
  BOOST_CHECK(matrix[0].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[0].size(), 4);
  }

  const Column col1(cont{{0, 1}, {1, 3}, {2, 4}, {5, 4}, {6, 4}}, &settings);
  matrix[1] += col1;

  veccont = {};
  BOOST_CHECK(matrix[1].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[1].size(), 0);
  }

  // this = v * this + column
  matrix[4].multiply_target_and_add(4, col1);
  veccont = {0, 1, 4, 2, 0, 0, 4};
  BOOST_CHECK(matrix[4].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[4].size(), 4);
  }
  // this = this + column * v
  const Column col2(cont{}, &settings);
  matrix[5].multiply_source_and_add(col2, 3);
  veccont = {4, 2, 1, 0, 0, 1, 1};
  BOOST_CHECK(matrix[5].get_content(veccont.size()) == veccont);
  BOOST_CHECK_EQUAL(matrix[5].size(), 5);
  // this = this + column * v
  const Column col3(cont{{0, 3}, {2, 1}, {3, 2}, {5, 2}, {6, 1}}, &settings);
  matrix[5].multiply_source_and_add(col3, 3);
  veccont = {3, 2, 4, 1, 0, 2, 4};
  BOOST_CHECK(matrix[5].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[5].size(), 6);
  }
  // this = v * this + column
  const Column col4(cont{{0, 3}, {1, 2}, {2, 4}, {3, 1}, {5, 2}, {6, 4}}, &settings);
  matrix[3].multiply_target_and_add(4, col4);
  veccont = {3, 2, 4, 1, 0, 2, 4};
  BOOST_CHECK(matrix[3].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[3].size(), 6);
  }
}